

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  uint uVar1;
  byte bVar2;
  short sVar3;
  sqlite3 *db;
  Schema *pSVar4;
  int iVar5;
  Table *pTab;
  Parse *pPVar6;
  Table *pTVar7;
  Column *pCVar8;
  byte *pbVar9;
  ExprList *pEVar10;
  u8 uVar11;
  Schema **ppSVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') &&
     (pTab = sqlite3LocateTableItem(pParse,0,pSrc->a), pTab != (Table *)0x0)) {
    if (pTab->eTabType == '\x02') {
      pcVar15 = "Cannot add a column to a view";
    }
    else {
      if (pTab->eTabType != '\x01') {
        iVar5 = isAlterableTable(pParse,pTab);
        if (iVar5 == 0) {
          pPVar6 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar6 = pParse;
          }
          pPVar6->mayAbort = '\x01';
          if (pTab->pSchema == (Schema *)0x0) {
            lVar14 = -0x8000;
          }
          else {
            lVar14 = -0x100000000;
            ppSVar12 = &db->aDb->pSchema;
            do {
              lVar14 = lVar14 + 0x100000000;
              pSVar4 = *ppSVar12;
              ppSVar12 = ppSVar12 + 4;
            } while (pSVar4 != pTab->pSchema);
            lVar14 = lVar14 >> 0x20;
          }
          pTVar7 = (Table *)sqlite3DbMallocZero(db,0x68);
          if (pTVar7 != (Table *)0x0) {
            pParse->pNewTable = pTVar7;
            pTVar7->nTabRef = 1;
            sVar3 = pTab->nCol;
            pTVar7->nCol = sVar3;
            uVar1 = (int)sVar3 - 1;
            uVar13 = (int)sVar3 + 6;
            if (-1 < (int)uVar1) {
              uVar13 = uVar1;
            }
            pCVar8 = (Column *)
                     sqlite3DbMallocZero(db,(long)(int)(uVar13 & 0xfffffff8) * 0x10 + 0x80);
            pTVar7->aCol = pCVar8;
            pcVar15 = sqlite3MPrintf(db,"sqlite_altertab_%s",pTab->zName);
            pTVar7->zName = pcVar15;
            if (pcVar15 != (char *)0x0 && pTVar7->aCol != (Column *)0x0) {
              memcpy(pTVar7->aCol,pTab->aCol,(long)pTVar7->nCol << 4);
              if (0 < pTVar7->nCol) {
                lVar16 = 0;
                do {
                  pCVar8 = pTVar7->aCol;
                  pbVar9 = (byte *)sqlite3DbStrDup(db,pCVar8[lVar16].zCnName);
                  pCVar8[lVar16].zCnName = (char *)pbVar9;
                  if ((pbVar9 == (byte *)0x0) || (bVar2 = *pbVar9, bVar2 == 0)) {
                    uVar11 = '\0';
                  }
                  else {
                    uVar11 = '\0';
                    do {
                      pbVar9 = pbVar9 + 1;
                      uVar11 = uVar11 + ""[bVar2];
                      bVar2 = *pbVar9;
                    } while (bVar2 != 0);
                  }
                  pCVar8[lVar16].hName = uVar11;
                  lVar16 = lVar16 + 1;
                } while (lVar16 < pTVar7->nCol);
              }
              pEVar10 = sqlite3ExprListDup(db,(pTab->u).tab.pDfltList,0);
              (pTVar7->u).tab.pDfltList = pEVar10;
              pTVar7->pSchema = db->aDb[lVar14].pSchema;
              (pTVar7->u).tab.addColOffset = (pTab->u).tab.addColOffset;
              pTVar7->nTabRef = 1;
            }
          }
        }
        goto LAB_001838e2;
      }
      pcVar15 = "virtual tables may not be altered";
    }
    sqlite3ErrorMsg(pParse,pcVar15);
  }
LAB_001838e2:
  sqlite3SrcListDelete(db,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_begin_add_column;
  }

  sqlite3MayAbort(pParse);
  assert( IsOrdinaryTable(pTab) );
  assert( pTab->u.tab.addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nTabRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    assert( db->mallocFailed );
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zCnName = sqlite3DbStrDup(db, pCol->zCnName);
    pCol->hName = sqlite3StrIHash(pCol->zCnName);
  }
  assert( IsOrdinaryTable(pNew) );
  pNew->u.tab.pDfltList = sqlite3ExprListDup(db, pTab->u.tab.pDfltList, 0);
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->u.tab.addColOffset = pTab->u.tab.addColOffset;
  pNew->nTabRef = 1;

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}